

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

bool getIntArguments<4>(char **lp,aint (*args) [4],bool (*argOptional) [4])

{
  bool bVar1;
  int iVar2;
  byte unaff_BPL;
  ulong uVar3;
  bool bVar4;
  aint val;
  aint local_3c;
  bool (*local_38) [4];
  
  uVar3 = 0;
  bVar4 = false;
  local_38 = argOptional;
  do {
    if ((uVar3 != 0) && (bVar1 = comma(lp), !bVar1)) {
      unaff_BPL = (*local_38)[uVar3];
      break;
    }
    iVar2 = ParseExpression(lp,&local_3c);
    if (iVar2 == 0) {
      unaff_BPL = uVar3 == 0 & (*local_38)[0];
      break;
    }
    (*args)[uVar3] = local_3c;
    bVar4 = 2 < uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 4);
  if (bVar4) {
    bVar4 = comma(lp);
    unaff_BPL = !bVar4;
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool getIntArguments(char*& lp, aint (&args)[argsN], const bool (&argOptional)[argsN]) {
	for (int i = 0; i < argsN; ++i) {
		if (0 < i && !comma(lp)) return argOptional[i];
		aint val;				// temporary variable to preserve original value in case of error
		if (!ParseExpression(lp, val)) return (0 == i) && argOptional[i];
		args[i] = val;
	}
	return !comma(lp);
}